

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaD_call(lua_State *L,StkId func,int nResults)

{
  double dVar1;
  undefined8 uVar2;
  byte bVar3;
  GCObject *pGVar4;
  StkId pTVar5;
  CallInfo *pCVar6;
  global_State *pgVar7;
  global_State *pgVar8;
  Value VVar9;
  double dVar10;
  double dVar11;
  uint *puVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  GCObject *pGVar16;
  GCObject *pGVar17;
  GCObject *pGVar18;
  Value *pVVar19;
  TValue *f;
  StkId pTVar20;
  TValue *pTVar21;
  Value *val;
  StkId pTVar22;
  long lVar23;
  int *piVar24;
  ulong uVar25;
  TValue *pTVar26;
  uint uVar27;
  uint *puVar28;
  uint *puVar29;
  char *fmt;
  TMS op;
  StkId level;
  uint uVar30;
  uint uVar31;
  long lVar32;
  Table *pTVar33;
  TValue *i_o;
  Value *pVVar34;
  StkId pTVar35;
  bool bVar36;
  TValue g;
  int local_5c;
  Value local_40;
  undefined4 local_38;
  
  uVar13 = *(int *)&L->nCcalls + 1;
  L->nCcalls = (unsigned_short)uVar13;
  uVar13 = uVar13 & 0xffff;
  if (uVar13 < 200) {
LAB_00105271:
    iVar14 = luaD_precall(L,func,nResults);
    if (iVar14 == 0) {
      local_5c = 1;
      do {
        level = L->base;
        pGVar4 = (L->ci->func->value).gc;
        pTVar5 = (StkId)((pGVar4->th).l_G)->frealloc;
        puVar28 = L->savedpc;
        do {
          puVar29 = puVar28 + 1;
          uVar13 = *puVar28;
          if (0x25 < (uVar13 & 0x3f)) {
            iVar14 = 0;
            goto LAB_0010656f;
          }
          uVar31 = uVar13 >> 6 & 0xff;
          pVVar34 = (Value *)((long)&level->value + (ulong)(uVar31 << 4));
          puVar12 = puVar29;
          switch(uVar13 & 0x3f) {
          case 0:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            *pVVar34 = *(Value *)((long)&level->value + uVar25);
            iVar14 = *(int *)((long)&level->tt + uVar25);
            goto LAB_001059cb;
          case 1:
            uVar25 = (ulong)(uVar13 >> 10 & 0xfffffff0);
            *pVVar34 = *(Value *)((long)&pTVar5->value + uVar25);
            iVar14 = *(int *)((long)&pTVar5->tt + uVar25);
            goto LAB_001059cb;
          case 2:
            pVVar34->b = uVar13 >> 0x17;
            pVVar34[1].b = 1;
            puVar12 = puVar28 + 2;
            if ((uVar13 & 0x7fc000) == 0) {
              puVar12 = puVar29;
            }
            goto LAB_001061f8;
          case 3:
            pVVar19 = (Value *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            do {
              pVVar19[1].b = 0;
              pVVar19 = pVVar19 + -2;
              iVar14 = 4;
            } while (pVVar34 <= pVVar19);
            break;
          case 4:
            pVVar19 = *(Value **)
                       (*(long *)((long)pGVar4 + (ulong)(uVar13 >> 0x17) * 8 + 0x28) + 0x10);
            *pVVar34 = *pVVar19;
            iVar14 = pVVar19[1].b;
LAB_001059cb:
            pVVar34[1].b = iVar14;
LAB_00106567:
            iVar14 = 4;
            break;
          case 5:
            pTVar21 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 10 & 0xfffffff0));
            local_40 = (Value)(pGVar4->h).array;
            pVVar19 = &local_40;
            local_38 = 5;
            L->savedpc = puVar29;
            goto LAB_00105be0;
          case 6:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            goto LAB_00105bc3;
          case 7:
            local_40 = (Value)(pGVar4->h).array;
            pVVar19 = &local_40;
            local_38 = 5;
            L->savedpc = puVar29;
            pTVar21 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 10 & 0xfffffff0));
            val = pVVar34;
            goto LAB_001059a5;
          case 8:
            lVar32 = *(long *)((long)pGVar4 + (ulong)(uVar13 >> 0x17) * 8 + 0x28);
            pVVar19 = *(Value **)(lVar32 + 0x10);
            *pVVar19 = *pVVar34;
            pVVar19[1].b = pVVar34[1].b;
            iVar14 = 4;
            if (((3 < pVVar34[1].b) && (((pVVar34->gc->gch).marked & 3) != 0)) &&
               ((*(byte *)(lVar32 + 9) & 4) != 0)) {
              pgVar7 = L->l_G;
              if (pgVar7->gcstate == '\x01') {
                reallymarkobject(pgVar7,pVVar34->gc);
                iVar14 = 4;
              }
              else {
                *(byte *)(lVar32 + 9) = pgVar7->currentwhite & 3 | *(byte *)(lVar32 + 9) & 0xf8;
              }
            }
            break;
          case 9:
            pTVar21 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar21 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            if ((uVar13 >> 0x16 & 1) != 0) {
              level = pTVar5;
            }
            L->savedpc = puVar29;
            val = (Value *)((long)&level->value + (ulong)(uVar13 >> 10 & 0xff0));
            pVVar19 = pVVar34;
LAB_001059a5:
            luaV_settable(L,(TValue *)pVVar19,pTVar21,(StkId)val);
            goto LAB_001061f4;
          case 10:
            uVar27 = uVar13 >> 0x11 & 0x1f;
            uVar31 = (uVar13 >> 0xe & 7 | 8) << ((char)uVar27 - 1U & 0x1f);
            if (uVar27 == 0) {
              uVar31 = uVar13 >> 0xe & 0x1ff;
            }
            uVar30 = uVar13 >> 0x1a & 0x1f;
            uVar27 = (uVar13 >> 0x17 & 7 | 8) << ((char)uVar30 - 1U & 0x1f);
            if (uVar30 == 0) {
              uVar27 = uVar13 >> 0x17;
            }
            pGVar18 = (GCObject *)luaH_new(L,uVar27,uVar31);
            pVVar34->gc = pGVar18;
            pVVar34[1].b = 5;
            L->savedpc = puVar29;
            if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
              luaC_step(L);
            }
            goto LAB_001061f4;
          case 0xb:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            pVVar34[2] = *(Value *)((long)&level->value + uVar25);
            pVVar34[3].b = *(int *)((long)&level->tt + uVar25);
LAB_00105bc3:
            pVVar19 = (Value *)((long)&level->value + uVar25);
            if ((uVar13 >> 0x16 & 1) != 0) {
              level = pTVar5;
            }
            L->savedpc = puVar29;
            pTVar21 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 10 & 0xff0));
LAB_00105be0:
            luaV_gettable(L,(TValue *)pVVar19,pTVar21,(StkId)pVVar34);
            goto LAB_001061f4;
          case 0xc:
            pTVar26 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar26 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            pTVar22 = pTVar5;
            if ((uVar13 >> 0x16 & 1) == 0) {
              pTVar22 = level;
            }
            pTVar21 = (TValue *)((long)&pTVar22->value + (ulong)(uVar13 >> 10 & 0xff0));
            if ((pTVar26->tt != 3) || (pTVar21->tt != 3)) {
              L->savedpc = puVar29;
              op = TM_ADD;
              goto LAB_001061ef;
            }
            dVar11 = (pTVar26->value).n + (pTVar21->value).n;
LAB_00105bad:
            pVVar34->n = dVar11;
LAB_00106267:
            pVVar34[1].b = 3;
            goto LAB_00106567;
          case 0xd:
            pTVar26 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar26 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            pTVar22 = pTVar5;
            if ((uVar13 >> 0x16 & 1) == 0) {
              pTVar22 = level;
            }
            pTVar21 = (TValue *)((long)&pTVar22->value + (ulong)(uVar13 >> 10 & 0xff0));
            if ((pTVar26->tt == 3) && (pTVar21->tt == 3)) {
              dVar11 = (pTVar26->value).n - (pTVar21->value).n;
              goto LAB_00105bad;
            }
            L->savedpc = puVar29;
            op = TM_SUB;
            goto LAB_001061ef;
          case 0xe:
            pTVar26 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar26 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            pTVar22 = pTVar5;
            if ((uVar13 >> 0x16 & 1) == 0) {
              pTVar22 = level;
            }
            pTVar21 = (TValue *)((long)&pTVar22->value + (ulong)(uVar13 >> 10 & 0xff0));
            if ((pTVar26->tt == 3) && (pTVar21->tt == 3)) {
              dVar11 = (pTVar26->value).n * (pTVar21->value).n;
              goto LAB_00105bad;
            }
            L->savedpc = puVar29;
            op = TM_MUL;
            goto LAB_001061ef;
          case 0xf:
            pTVar26 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar26 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            pTVar22 = pTVar5;
            if ((uVar13 >> 0x16 & 1) == 0) {
              pTVar22 = level;
            }
            pTVar21 = (TValue *)((long)&pTVar22->value + (ulong)(uVar13 >> 10 & 0xff0));
            if ((pTVar26->tt == 3) && (pTVar21->tt == 3)) {
              dVar11 = (pTVar26->value).n / (pTVar21->value).n;
              goto LAB_00105bad;
            }
            L->savedpc = puVar29;
            op = TM_DIV;
            goto LAB_001061ef;
          case 0x10:
            pTVar26 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar26 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            pTVar22 = pTVar5;
            if ((uVar13 >> 0x16 & 1) == 0) {
              pTVar22 = level;
            }
            pTVar21 = (TValue *)((long)&pTVar22->value + (ulong)(uVar13 >> 10 & 0xff0));
            if ((pTVar26->tt != 3) || (pTVar21->tt != 3)) {
              L->savedpc = puVar29;
              op = TM_MOD;
              goto LAB_001061ef;
            }
            dVar11 = (pTVar26->value).n;
            dVar1 = (pTVar21->value).n;
            dVar10 = floor(dVar11 / dVar1);
            pVVar34->n = dVar11 - dVar10 * dVar1;
LAB_00105ab6:
            pVVar34[1].b = 3;
            goto LAB_001061f8;
          case 0x11:
            pTVar26 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar26 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            pTVar22 = pTVar5;
            if ((uVar13 >> 0x16 & 1) == 0) {
              pTVar22 = level;
            }
            pTVar21 = (TValue *)((long)&pTVar22->value + (ulong)(uVar13 >> 10 & 0xff0));
            if ((pTVar26->tt == 3) && (pTVar21->tt == 3)) {
              dVar11 = pow((pTVar26->value).n,(pTVar21->value).n);
LAB_00105ab1:
              pVVar34->n = dVar11;
              goto LAB_00105ab6;
            }
            L->savedpc = puVar29;
            op = TM_POW;
            goto LAB_001061ef;
          case 0x12:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            pTVar21 = (TValue *)((long)&level->value + uVar25);
            if (*(int *)((long)&level->tt + uVar25) == 3) {
              pVVar34->gc = (GCObject *)((ulong)(pTVar21->value).gc ^ 0x8000000000000000);
              goto LAB_00106267;
            }
            L->savedpc = puVar29;
            op = TM_UNM;
            pTVar26 = pTVar21;
LAB_001061ef:
            Arith(L,(StkId)pVVar34,pTVar26,pTVar21,op);
            goto LAB_001061f4;
          case 0x13:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            iVar14 = *(int *)((long)&level->tt + uVar25);
            if (iVar14 == 0) {
              uVar13 = 1;
            }
            else if (iVar14 == 1) {
              uVar13 = (uint)(*(int *)((long)&level->value + uVar25) == 0);
            }
            else {
              uVar13 = 0;
            }
            *(uint *)pVVar34 = uVar13;
            pVVar34[1].b = 1;
            goto LAB_00106567;
          case 0x14:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            pTVar21 = (TValue *)((long)&level->value + uVar25);
            iVar14 = *(int *)((long)&level->tt + uVar25);
            if (iVar14 == 4) {
              uVar2 = *(undefined8 *)((long)(pTVar21->value).gc + 0x10);
              pVVar34->n = ((double)CONCAT44(0x45300000,(int)((ulong)uVar2 >> 0x20)) -
                           1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
              goto LAB_00106267;
            }
            if (iVar14 == 5) {
              iVar14 = luaH_getn(&((pTVar21->value).gc)->h);
              dVar11 = (double)iVar14;
              goto LAB_00105ab1;
            }
            L->savedpc = puVar29;
            iVar14 = call_binTM(L,pTVar21,&luaO_nilobject_,(StkId)pVVar34,TM_LEN);
            if (iVar14 == 0) {
              luaG_runerror(L,"attempt to %s a %s value","get length of",luaT_typenames[pTVar21->tt]
                           );
            }
            goto LAB_001061f4;
          case 0x15:
            uVar27 = uVar13 >> 0xe & 0x1ff;
            L->savedpc = puVar29;
            luaV_concat(L,(uVar27 - (uVar13 >> 0x17)) + 1,uVar27);
            if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
              luaC_step(L);
            }
            level = L->base;
            uVar25 = (ulong)((uVar13 >> 0x17) << 4);
            *(undefined8 *)((long)&level->value + (ulong)(uVar31 << 4)) =
                 *(undefined8 *)((long)&level->value + uVar25);
            *(undefined4 *)((long)&level->tt + (ulong)(uVar31 << 4)) =
                 *(undefined4 *)((long)&level->tt + uVar25);
            goto LAB_001061f8;
          case 0x16:
            goto switchD_001052f8_caseD_16;
          case 0x17:
            pTVar21 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar21 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            if ((uVar13 >> 0x16 & 1) != 0) {
              level = pTVar5;
            }
            uVar25 = (ulong)(uVar13 >> 10 & 0xff0);
            L->savedpc = puVar29;
            if (pTVar21->tt == *(int *)((long)&level->tt + uVar25)) {
              pTVar26 = (TValue *)((long)&level->value + uVar25);
              bVar36 = true;
              switch(pTVar21->tt) {
              case 0:
                break;
              case 1:
                bVar36 = (pTVar21->value).b == (pTVar26->value).b;
                break;
              default:
                bVar36 = (pTVar21->value).gc == (pTVar26->value).gc;
                break;
              case 3:
                bVar36 = (bool)(-((pTVar26->value).n == (pTVar21->value).n) & 1);
                break;
              case 5:
              case 7:
                VVar9 = pTVar26->value;
                if ((pTVar21->value).gc != VVar9.gc) {
                  f = get_compTM(L,(((pTVar21->value).gc)->h).metatable,
                                 *(Table **)((long)VVar9.gc + 0x10),VVar9.b);
                  if (f != (TValue *)0x0) {
                    callTMres(L,L->top,f,pTVar21,pTVar26);
                    iVar14 = L->top->tt;
                    if (iVar14 != 0) {
                      if (iVar14 == 1) {
                        bVar36 = (L->top->value).b != 0;
                      }
                      break;
                    }
                  }
                  bVar36 = false;
                }
              }
            }
            else {
              bVar36 = false;
            }
            uVar13 = (uint)bVar36;
            goto joined_r0x0010654c;
          case 0x18:
            pTVar21 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar21 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            if ((uVar13 >> 0x16 & 1) != 0) {
              level = pTVar5;
            }
            L->savedpc = puVar29;
            uVar13 = luaV_lessthan(L,pTVar21,
                                   (TValue *)((long)&level->value + (ulong)(uVar13 >> 10 & 0xff0)));
            if (uVar13 == uVar31) {
              puVar29 = puVar28 + ((ulong)(*puVar29 >> 0xe) - 0x1fffe);
            }
            level = L->base;
            goto LAB_001058bf;
          case 0x19:
            L->savedpc = puVar29;
            pTVar21 = (TValue *)((long)&level->value + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            if ((int)uVar13 < 0) {
              pTVar21 = (TValue *)((long)&pTVar5->value + (ulong)(uVar13 >> 0x13 & 0xff0));
            }
            if ((uVar13 >> 0x16 & 1) != 0) {
              level = pTVar5;
            }
            uVar25 = (ulong)(uVar13 >> 10 & 0xff0);
            pTVar26 = (TValue *)((long)&level->value + uVar25);
            iVar14 = pTVar21->tt;
            if (iVar14 == *(int *)((long)&level->tt + uVar25)) {
              if (iVar14 == 4) {
                iVar14 = l_strcmp(&((pTVar21->value).gc)->ts,&((pTVar26->value).gc)->ts);
                uVar13 = (uint)(iVar14 < 1);
              }
              else if (iVar14 == 3) {
                uVar13 = (uint)((pTVar21->value).n <= (pTVar26->value).n);
              }
              else {
                uVar13 = call_orderTM(L,pTVar21,pTVar26,TM_LE);
                if (uVar13 == 0xffffffff) {
                  iVar14 = call_orderTM(L,pTVar26,pTVar21,TM_LT);
                  if (iVar14 == -1) {
                    luaG_ordererror(L,pTVar21,pTVar26);
                    uVar13 = 0;
                  }
                  else {
                    uVar13 = (uint)(iVar14 == 0);
                  }
                }
              }
            }
            else {
              luaG_ordererror(L,pTVar21,pTVar26);
              uVar13 = 0;
            }
joined_r0x0010654c:
            if (uVar13 == uVar31) {
              puVar29 = puVar29 + ((ulong)(*puVar29 >> 0xe) - 0x1ffff);
            }
            level = L->base;
            goto LAB_00106563;
          case 0x1a:
            if (pVVar34[1].b == 0) {
              uVar31 = 1;
            }
            else if (pVVar34[1].b == 1) {
              uVar31 = (uint)(pVVar34->b == 0);
            }
            else {
              uVar31 = 0;
            }
            if (uVar31 != (uVar13 >> 0xe & 0x1ff)) {
LAB_00106362:
              puVar29 = puVar29 + ((ulong)(*puVar29 >> 0xe) - 0x1ffff);
            }
            goto LAB_00106563;
          case 0x1b:
            uVar25 = (ulong)(uVar13 >> 0x13 & 0xfffffff0);
            pVVar19 = (Value *)((long)&level->value + uVar25);
            iVar14 = *(int *)((long)&level->tt + uVar25);
            if (iVar14 == 0) {
              uVar31 = 1;
            }
            else {
              uVar31 = 0;
              if (iVar14 == 1) {
                uVar31 = (uint)(pVVar19->b == 0);
              }
            }
            if (uVar31 != (uVar13 >> 0xe & 0x1ff)) {
              *pVVar34 = *pVVar19;
              pVVar34[1].b = iVar14;
              goto LAB_00106362;
            }
LAB_00106563:
            puVar29 = puVar29 + 1;
            goto LAB_00106567;
          case 0x1c:
            if (0x7fffff < uVar13) {
              L->top = (StkId)((long)pVVar34 + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            }
            uVar13 = uVar13 >> 0xe & 0x1ff;
            L->savedpc = puVar29;
            iVar14 = luaD_precall(L,(StkId)pVVar34,uVar13 - 1);
            if (iVar14 == 0) {
              local_5c = local_5c + 1;
              iVar14 = 2;
            }
            else {
              if (iVar14 == 1) {
                if (uVar13 != 0) {
                  L->top = L->ci->top;
                }
                goto LAB_001061f4;
              }
LAB_00105fe3:
              iVar14 = 1;
            }
            break;
          case 0x1d:
            if (0x7fffff < uVar13) {
              L->top = (StkId)((long)pVVar34 + (ulong)(uVar13 >> 0x13 & 0xfffffff0));
            }
            L->savedpc = puVar29;
            iVar14 = luaD_precall(L,(StkId)pVVar34,-1);
            if (iVar14 != 0) {
              if (iVar14 != 1) goto LAB_00105fe3;
              goto LAB_001061f4;
            }
            pCVar6 = L->ci;
            pTVar22 = pCVar6[-1].func;
            pTVar35 = pCVar6->func;
            if (L->openupval != (GCObject *)0x0) {
              luaF_close(L,pCVar6[-1].base);
            }
            pTVar20 = (StkId)(((long)pCVar6->base - (long)pTVar35) + (long)pCVar6[-1].func);
            pCVar6[-1].base = pTVar20;
            L->base = pTVar20;
            if (pTVar35 < L->top) {
              piVar24 = &pTVar22->tt;
              lVar32 = 0;
              do {
                ((TValue *)(piVar24 + -2))->value = pTVar35->value;
                *piVar24 = pTVar35->tt;
                lVar32 = lVar32 + 1;
                pTVar35 = pTVar35 + 1;
                piVar24 = piVar24 + 4;
              } while (pTVar35 < L->top);
            }
            else {
              lVar32 = 0;
            }
            pTVar22 = pTVar22 + lVar32;
            L->top = pTVar22;
            pCVar6[-1].top = pTVar22;
            pCVar6[-1].savedpc = L->savedpc;
            pCVar6[-1].tailcalls = pCVar6[-1].tailcalls + 1;
            L->ci = L->ci + -1;
            iVar14 = 2;
            break;
          case 0x1e:
            if (0x7fffff < uVar13) {
              L->top = (StkId)((long)pVVar34 + ((ulong)(uVar13 >> 0x13 & 0xfffffff0) - 0x10));
            }
            if (L->openupval != (GCObject *)0x0) {
              luaF_close(L,level);
            }
            L->savedpc = puVar29;
            iVar15 = luaD_poscall(L,(StkId)pVVar34);
            local_5c = local_5c + -1;
            if (local_5c == 0) {
              iVar14 = 1;
            }
            else {
              iVar14 = 2;
              if (iVar15 != 0) {
                L->top = L->ci->top;
              }
            }
            break;
          case 0x1f:
            dVar11 = pVVar34->n + pVVar34[4].n;
            iVar14 = 4;
            if (pVVar34[4].n <= 0.0) {
              if (pVVar34[2].n <= dVar11) goto LAB_001061ad;
            }
            else if (dVar11 <= pVVar34[2].n) {
LAB_001061ad:
              puVar29 = puVar29 + ((ulong)(uVar13 >> 0xe) - 0x1ffff);
              pVVar34->n = dVar11;
              pVVar34[1].b = 3;
              pVVar34[6].n = dVar11;
              pVVar34[7].b = 3;
              iVar14 = 4;
            }
            break;
          case 0x20:
            L->savedpc = puVar29;
            if ((pVVar34[1].b != 3) &&
               (pTVar21 = luaV_tonumber((TValue *)pVVar34,(TValue *)pVVar34),
               pTVar21 == (TValue *)0x0)) goto LAB_001065d7;
            if ((pVVar34[3].b == 3) ||
               (pTVar21 = luaV_tonumber((TValue *)(pVVar34 + 2),(TValue *)(pVVar34 + 2)),
               pTVar21 != (TValue *)0x0)) {
              pVVar19 = pVVar34 + 4;
              if ((pVVar34[5].b == 3) ||
                 (pVVar19 = &luaV_tonumber((TValue *)pVVar19,(TValue *)pVVar19)->value,
                 pVVar19 != (Value *)0x0)) {
                pVVar34->n = pVVar34->n - pVVar19->n;
                pVVar34[1].b = 3;
switchD_001052f8_caseD_16:
                puVar12 = puVar29 + ((ulong)(uVar13 >> 0xe) - 0x1ffff);
                goto LAB_001061f8;
              }
              fmt = "\'for\' step must be a number";
            }
            else {
              fmt = "\'for\' limit must be a number";
            }
            goto LAB_001065f0;
          case 0x21:
            pVVar34[10] = pVVar34[4];
            pVVar34[0xb].b = pVVar34[5].b;
            pVVar34[8] = pVVar34[2];
            pVVar34[9].b = pVVar34[3].b;
            pVVar34[6] = *pVVar34;
            pVVar34[7].b = pVVar34[1].b;
            L->top = (StkId)(pVVar34 + 0xc);
            L->savedpc = puVar29;
            luaD_call(L,(StkId)(pVVar34 + 6),uVar13 >> 0xe & 0x1ff);
            level = L->base;
            L->top = L->ci->top;
            uVar25 = (ulong)(uVar31 << 4);
            iVar14 = *(int *)((long)&level[3].tt + uVar25);
            if (iVar14 != 0) {
              *(undefined8 *)((long)&level[2].value + uVar25) =
                   *(undefined8 *)((long)&level[3].value + uVar25);
              *(int *)((long)&level[2].tt + uVar25) = iVar14;
              puVar29 = puVar28 + ((ulong)(*puVar29 >> 0xe) - 0x1fffe);
            }
LAB_001058bf:
            puVar12 = puVar29 + 1;
            goto LAB_001061f8;
          case 0x22:
            if (uVar13 < 0x800000) {
              uVar27 = (int)((ulong)((long)L->top - (long)pVVar34) >> 4) - 1;
              L->top = L->ci->top;
            }
            else {
              uVar27 = uVar13 >> 0x17;
            }
            uVar13 = uVar13 >> 0xe & 0x1ff;
            if (uVar13 == 0) {
              uVar13 = puVar28[1];
              puVar29 = puVar28 + 2;
            }
            iVar14 = 0;
            if (pVVar34[1].b == 5) {
              pGVar18 = pVVar34->gc;
              iVar14 = uVar27 + uVar13 * 0x32 + -0x32;
              if ((pGVar18->h).sizearray < iVar14) {
                if ((pGVar18->h).node == &dummynode_) {
                  iVar15 = 0;
                }
                else {
                  iVar15 = (int)(1L << ((pGVar18->h).lsizenode & 0x3f));
                }
                resize(L,&pGVar18->h,iVar14,iVar15);
              }
              iVar14 = 4;
              if ((int)uVar27 < 1) goto LAB_001064ed;
              piVar24 = (int *)((long)&level[uVar27].tt + (ulong)(uVar31 << 4));
              uVar25 = (ulong)uVar27;
              do {
                pTVar21 = luaH_setnum(L,&pGVar18->h,uVar13 * 0x32 + -0x32 + (int)uVar25);
                pTVar21->value = *(Value *)(piVar24 + -2);
                pTVar21->tt = *piVar24;
                if (((3 < *piVar24) && ((*(byte *)(*(long *)(piVar24 + -2) + 9) & 3) != 0)) &&
                   (((pGVar18->gch).marked & 4) != 0)) {
                  pgVar7 = L->l_G;
                  (pGVar18->gch).marked = (pGVar18->gch).marked & 0xfb;
                  (pGVar18->h).gclist = pgVar7->grayagain;
                  pgVar7->grayagain = pGVar18;
                }
                piVar24 = piVar24 + -4;
                bVar36 = 1 < (long)uVar25;
                uVar25 = uVar25 - 1;
              } while (bVar36);
            }
            break;
          case 0x23:
            luaF_close(L,(StkId)pVVar34);
            goto LAB_001061f8;
          case 0x24:
            pGVar18 = (&(((((pGVar4->h).node)->i_key).nk.next)->i_val).value)[uVar13 >> 0xe].gc;
            bVar3 = (byte)*(lu_mem *)&(pGVar18->p).nups;
            pGVar16 = (GCObject *)luaF_newLclosure(L,(uint)bVar3,(Table *)(pGVar4->h).array);
            (pGVar16->th).l_G = (global_State *)pGVar18;
            if (bVar3 != 0) {
              uVar25 = 0;
              do {
                uVar13 = *puVar29 >> 0x17;
                if ((*puVar29 & 0x3f) == 4) {
                  pGVar17 = *(GCObject **)((long)pGVar4 + (ulong)uVar13 * 8 + 0x28);
                }
                else {
                  pTVar33 = (Table *)((long)&level->value + (ulong)(uVar13 << 4));
                  pgVar7 = L->l_G;
                  pGVar18 = (GCObject *)&L->openupval;
                  do {
                    pGVar17 = (pGVar18->gch).next;
                    if ((pGVar17 == (GCObject *)0x0) || ((pGVar17->h).metatable < pTVar33)) {
                      pGVar17 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x28);
                      (pGVar17->gch).tt = '\n';
                      (pGVar17->gch).marked = pgVar7->currentwhite & 3;
                      (pGVar17->h).metatable = pTVar33;
                      (pGVar17->gch).next = (pGVar18->gch).next;
                      (pGVar18->gch).next = pGVar17;
                      (pGVar17->h).array = (TValue *)&pgVar7->uvhead;
                      pgVar8 = (global_State *)(pgVar7->uvhead).u.l.next;
                      (pGVar17->th).l_G = pgVar8;
                      pgVar8->ud = pGVar17;
                      (pgVar7->uvhead).u.l.next = (UpVal *)pGVar17;
                      goto LAB_001054d1;
                    }
                    pGVar18 = pGVar17;
                  } while ((pGVar17->h).metatable != pTVar33);
                  if ((~pgVar7->currentwhite & (pGVar17->gch).marked & 3) != 0) {
                    (pGVar17->gch).marked = (pGVar17->gch).marked ^ 3;
                  }
                }
LAB_001054d1:
                *(GCObject **)((long)pGVar16 + uVar25 * 8 + 0x28) = pGVar17;
                uVar25 = uVar25 + 1;
                puVar29 = puVar29 + 1;
              } while (uVar25 != bVar3);
            }
            pVVar34->gc = pGVar16;
            pVVar34[1].b = 6;
            L->savedpc = puVar29;
            if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
              luaC_step(L);
            }
LAB_001061f4:
            level = L->base;
            puVar12 = puVar29;
LAB_001061f8:
            puVar29 = puVar12;
            iVar14 = 4;
            break;
          case 0x25:
            pCVar6 = L->ci;
            uVar27 = ~(uint)*(byte *)((long)&((pGVar4->th).l_G)->GCthreshold + 1) +
                     (int)((ulong)((long)pCVar6->base - (long)pCVar6->func) >> 4);
            lVar32 = (long)(int)uVar27;
            if (uVar13 < 0x800000) {
              L->savedpc = puVar29;
              if ((long)L->stack_last - (long)L->top <= (long)(int)(uVar27 * 0x10)) {
                luaD_growstack(L,uVar27);
              }
              level = L->base;
              pVVar34 = (Value *)((long)&level->value + (ulong)(uVar31 << 4));
              L->top = (StkId)(pVVar34 + lVar32 * 2);
            }
            else {
              uVar27 = (uVar13 >> 0x17) - 1;
            }
            if (0 < (int)uVar27) {
              pVVar34 = pVVar34 + 1;
              lVar23 = lVar32 * -0x10;
              uVar25 = 0;
              do {
                if ((long)uVar25 < lVar32) {
                  pTVar22 = pCVar6->base;
                  *(undefined8 *)(&pVVar34->b + -2) =
                       *(undefined8 *)((long)&pTVar22->value + lVar23);
                  pVVar34->b = *(int *)((long)&pTVar22->tt + lVar23);
                }
                else {
                  pVVar34->b = 0;
                }
                uVar25 = uVar25 + 1;
                pVVar34 = (Value *)(&pVVar34->b + 4);
                lVar23 = lVar23 + 0x10;
              } while (uVar27 != uVar25);
            }
LAB_001064ed:
            iVar14 = 4;
          }
LAB_0010656f:
          puVar28 = puVar29;
        } while ((iVar14 == 0) || (iVar14 == 4));
      } while (iVar14 == 2);
    }
    L->nCcalls = L->nCcalls - 1;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
      return;
    }
    return;
  }
  if (uVar13 == 200) {
    fmt = "C stack overflow";
  }
  else {
    if (uVar13 < 0xe1) goto LAB_00105271;
    luaD_throw(L,5);
LAB_001065d7:
    fmt = "\'for\' initial value must be a number";
  }
LAB_001065f0:
  luaG_runerror(L,fmt);
}

Assistant:

static void luaD_call(lua_State*L,StkId func,int nResults){
if(++L->nCcalls>=200){
if(L->nCcalls==200)
luaG_runerror(L,"C stack overflow");
else if(L->nCcalls>=(200+(200>>3)))
luaD_throw(L,5);
}
if(luaD_precall(L,func,nResults)==0)
luaV_execute(L,1);
L->nCcalls--;
luaC_checkGC(L);
}